

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O3

void __thiscall bandit::reporter::info::context_ended(info *this,string *desc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _Map_pointer ppcVar3;
  pointer pcVar4;
  context_info *pcVar5;
  context_info *pcVar6;
  _Elt_pointer pcVar7;
  context_info *pcVar8;
  context_info *pcVar9;
  context_info context;
  long *local_58 [2];
  long local_48 [2];
  undefined8 local_38;
  int local_30;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&(this->super_colored_base).super_progress_base.contexts_,
             *(_List_node_base **)
              ((long)&(this->super_colored_base).super_progress_base.contexts_.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node.super__List_node_base + 8));
  ppcVar3 = (this->context_stack_).c.
            super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  pcVar9 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pcVar6 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  if (((long)(this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * -0x5555555555555555 +
      ((long)pcVar9 - (long)pcVar6 >> 4) * -0x5555555555555555 +
      (((long)ppcVar3 -
        (long)(this->context_stack_).c.
              super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(ppcVar3 == (_Map_pointer)0x0)) * 10 != 1) {
    if (pcVar9 == pcVar6) {
      pcVar5 = ppcVar3[-1] + 9;
      pcVar8 = ppcVar3[-1] + 10;
    }
    else {
      pcVar5 = pcVar9 + -1;
      pcVar8 = pcVar9;
    }
    if (pcVar5->total <= pcVar8[-1].skipped) goto LAB_0010a2df;
  }
  output_context_end_message(this);
  pcVar9 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pcVar6 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_0010a2df:
  if (pcVar9 == pcVar6) {
    pcVar9 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
  }
  pcVar4 = pcVar9[-1].desc._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar4,pcVar4 + pcVar9[-1].desc._M_string_length);
  local_30 = pcVar9[-1].failed;
  local_38._0_4_ = pcVar9[-1].total;
  local_38._4_4_ = pcVar9[-1].skipped;
  std::
  deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
  ::pop_back(&(this->context_stack_).c);
  pcVar7 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar7 != (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (pcVar7 == (this->context_stack_).c.
                  super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pcVar7 = (this->context_stack_).c.
               super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    uVar1 = pcVar7[-1].total;
    uVar2 = pcVar7[-1].skipped;
    pcVar7[-1].total = uVar1 + (int)local_38;
    pcVar7[-1].skipped = uVar2 + (int)((ulong)local_38 >> 0x20);
    pcVar7[-1].failed = pcVar7[-1].failed + local_30;
  }
  if (0 < this->not_yet_shown_) {
    this->not_yet_shown_ = this->not_yet_shown_ + -1;
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

void context_ended(const std::string& desc) override {
        progress_base::context_ended(desc);
        if (context_stack_.size() == 1 || context_stack_.top().total > context_stack_.top().skipped) {
          output_context_end_message();
        }
        const context_info context = context_stack_.top(); // copy
        context_stack_.pop();
        if (!context_stack_.empty()) {
          context_stack_.top().merge(context);
        }
        if (not_yet_shown_ > 0) {
          --not_yet_shown_;
        }
      }